

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

void __thiscall QAuthenticatorPrivate::QAuthenticatorPrivate(QAuthenticatorPrivate *this)

{
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  int iVar4;
  void *pvVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QArrayData *local_68;
  Algorithm local_60;
  storage_type *local_58;
  QArrayData *local_50 [3];
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->password).d.size = 0;
  (this->options).d = (Data *)0x0;
  (this->password).d.d = (Data *)0x0;
  (this->password).d.ptr = (char16_t *)0x0;
  (this->extractedUser).d.ptr = (char16_t *)0x0;
  (this->extractedUser).d.size = 0;
  (this->user).d.size = 0;
  (this->extractedUser).d.d = (Data *)0x0;
  (this->user).d.d = (Data *)0x0;
  (this->user).d.ptr = (char16_t *)0x0;
  this->method = None;
  (this->realm).d.d = (Data *)0x0;
  (this->realm).d.ptr = (char16_t *)0x0;
  (this->realm).d.size = 0;
  (this->challenge).d.d = (Data *)0x0;
  (this->challenge).d.ptr = (char *)0x0;
  (this->challenge).d.size = 0;
  *(undefined8 *)((long)&(this->challenge).d.size + 1) = 0;
  *(undefined8 *)((long)&(this->gssApiHandles).d + 1) = 0;
  *(undefined8 *)&this->phase = 0;
  *(undefined8 *)((long)&(this->cnonce).d.d + 4) = 0;
  *(undefined8 *)((long)&(this->cnonce).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->cnonce).d.size + 4) = 0;
  (this->workstation).d.d = (Data *)0x0;
  (this->workstation).d.ptr = (char16_t *)0x0;
  (this->workstation).d.size = 0;
  (this->userDomain).d.d = (Data *)0x0;
  (this->userDomain).d.ptr = (char16_t *)0x0;
  (this->userDomain).d.size = 0;
  pvVar5 = (void *)QRandomGenerator64::system();
  iVar4 = QRandomGenerator::_fillRange(pvVar5,0);
  QByteArray::number((ulonglong)&local_68,iVar4);
  QVar6.m_data = local_58;
  QVar6.m_size = (qsizetype)local_50;
  QCryptographicHash::hash(QVar6,local_60);
  QByteArray::toHex((char)&local_38);
  pQVar1 = &((this->cnonce).d.d)->super_QArrayData;
  pcVar2 = (this->cnonce).d.ptr;
  *(undefined4 *)&(this->cnonce).d.d = (undefined4)local_38;
  *(undefined4 *)((long)&(this->cnonce).d.d + 4) = local_38._4_4_;
  *(undefined4 *)&(this->cnonce).d.ptr = (undefined4)uStack_30;
  *(undefined4 *)((long)&(this->cnonce).d.ptr + 4) = uStack_30._4_4_;
  qVar3 = (this->cnonce).d.size;
  (this->cnonce).d.size = local_28;
  local_38 = pQVar1;
  uStack_30 = pcVar2;
  local_28 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],1,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  this->nonceCount = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAuthenticatorPrivate::QAuthenticatorPrivate()
    : method(None)
    , hasFailed(false)
    , phase(Start)
    , nonceCount(0)
{
    cnonce = QCryptographicHash::hash(QByteArray::number(QRandomGenerator::system()->generate64(), 16),
                                      QCryptographicHash::Md5).toHex();
    nonceCount = 0;
}